

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# banner.cpp
# Opt level: O2

void OutputBanner(ofstream *ostream,Banner *banner)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  
  SerializeData<unsigned_short>(ostream,banner->version);
  SerializeData<unsigned_short>(ostream,banner->crc);
  for (lVar2 = 6; lVar2 != 0; lVar2 = lVar2 + -2) {
    SerializeData<unsigned_short>(ostream,0);
  }
  lVar2 = 0x16;
  while( true ) {
    bVar3 = lVar2 == 0;
    lVar2 = lVar2 + -1;
    cVar1 = (char)ostream;
    if (bVar3) break;
    std::ostream::put(cVar1);
  }
  for (lVar2 = 0; lVar2 != 0x200; lVar2 = lVar2 + 1) {
    std::ostream::put(cVar1);
  }
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    std::ostream::put(cVar1);
  }
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 2) {
    SerializeData<unsigned_short>
              (ostream,*(unsigned_short *)((long)(banner->japanese_title)._M_elems + lVar2));
  }
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 2) {
    SerializeData<unsigned_short>
              (ostream,*(unsigned_short *)((long)(banner->english_title)._M_elems + lVar2));
  }
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 2) {
    SerializeData<unsigned_short>
              (ostream,*(unsigned_short *)((long)(banner->french_title)._M_elems + lVar2));
  }
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 2) {
    SerializeData<unsigned_short>
              (ostream,*(unsigned_short *)((long)(banner->german_title)._M_elems + lVar2));
  }
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 2) {
    SerializeData<unsigned_short>
              (ostream,*(unsigned_short *)((long)(banner->italian_title)._M_elems + lVar2));
  }
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 2) {
    SerializeData<unsigned_short>
              (ostream,*(unsigned_short *)((long)(banner->spanish_title)._M_elems + lVar2));
  }
  return;
}

Assistant:

void OutputBanner(std::ofstream& ostream, const Banner& banner) {
    SerializeData<u16>(ostream, banner.version);
    SerializeData<u16>(ostream, banner.crc);

    for ([[maybe_unused]] u16 i : banner.crc_padding) {
        SerializeData<u16>(ostream, 0);
    }

    for ([[maybe_unused]] u8 i : banner.padding) {
        SerializeData<u8>(ostream, 0);
    }

    for (u8 i : banner.bitmap) {
        SerializeData<u8>(ostream, i);
    }

    for (u8 i : banner.palette) {
        SerializeData<u8>(ostream, i);
    }

    for (char16_t c : banner.japanese_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.english_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.french_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.german_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.italian_title) {
        SerializeData<u16>(ostream, c);
    }

    for (char16_t c : banner.spanish_title) {
        SerializeData<u16>(ostream, c);
    }
}